

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_UnsignedLongLongIntReturnValueCanBeRetrieved_Test::testBody
          (TEST_MockReturnValueTest_UnsignedLongLongIntReturnValueCanBeRetrieved_Test *this)

{
  undefined8 uVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  undefined4 extraout_var_00;
  cpputest_ulonglong cVar5;
  TestTerminator *pTVar6;
  SimpleString local_b8;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  SimpleString local_28;
  undefined8 local_18;
  unsigned_long_long expected_value;
  TEST_MockReturnValueTest_UnsignedLongLongIntReturnValueCanBeRetrieved_Test *this_local;
  
  local_18 = 2;
  expected_value = (unsigned_long_long)this;
  SimpleString::SimpleString(&local_28,"");
  pMVar3 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_48);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf0))
            ((long *)CONCAT44(extraout_var,iVar2),local_18);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  SimpleString::SimpleString(&local_a8,"");
  pMVar3 = mock(&local_a8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_b8);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xa8))(&local_98);
  cVar5 = MockNamedValue::getUnsignedLongLongIntValue(&local_98);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x11])
            (pUVar4,uVar1,cVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x96,pTVar6);
  MockNamedValue::~MockNamedValue(&local_98);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&local_a8);
  return;
}

Assistant:

TEST(MockReturnValueTest, UnsignedLongLongIntReturnValueCanBeRetrieved)
{
    unsigned long long int expected_value = 2ULL;
    mock().expectOneCall("foo").andReturnValue(expected_value);
    UNSIGNED_LONGLONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getUnsignedLongLongIntValue());
}